

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int MeCab::decode_charset(char *charset)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *in_RDI;
  string tmp;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  allocator local_31;
  string local_30 [44];
  int local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RDI,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  toLower((string *)
          CONCAT17(in_stack_ffffffffffffffa7,
                   CONCAT16(in_stack_ffffffffffffffa6,
                            CONCAT15(in_stack_ffffffffffffffa5,
                                     CONCAT14(in_stack_ffffffffffffffa4,
                                              CONCAT13(in_stack_ffffffffffffffa3,
                                                       CONCAT12(in_stack_ffffffffffffffa2,
                                                                CONCAT11(in_stack_ffffffffffffffa1,
                                                                         in_stack_ffffffffffffffa0))
                                                      ))))));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,
                                            CONCAT15(in_stack_ffffffffffffff95,
                                                     CONCAT14(in_stack_ffffffffffffff94,
                                                              in_stack_ffffffffffffff90)))),
                          in_stack_ffffffffffffff88);
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,
                                     CONCAT16(in_stack_ffffffffffffff96,
                                              CONCAT15(in_stack_ffffffffffffff95,
                                                       CONCAT14(in_stack_ffffffffffffff94,
                                                                in_stack_ffffffffffffff90)))),
                            in_stack_ffffffffffffff88);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,
                                                CONCAT15(in_stack_ffffffffffffff95,
                                                         CONCAT14(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90)))),
                              in_stack_ffffffffffffff88);
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff97,
                                          CONCAT16(in_stack_ffffffffffffff96,
                                                   CONCAT15(in_stack_ffffffffffffff95,
                                                            CONCAT14(in_stack_ffffffffffffff94,
                                                                     in_stack_ffffffffffffff90)))),
                                in_stack_ffffffffffffff88);
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff97,
                                              CONCAT16(in_stack_ffffffffffffff96,
                                                       CONCAT15(in_stack_ffffffffffffff95,
                                                                CONCAT14(in_stack_ffffffffffffff94,
                                                                         in_stack_ffffffffffffff90))
                                                      )),in_stack_ffffffffffffff88);
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_ffffffffffffff97,
                                                CONCAT16(in_stack_ffffffffffffff96,
                                                         CONCAT15(in_stack_ffffffffffffff95,
                                                                  CONCAT14(in_stack_ffffffffffffff94
                                                                           ,
                                                  in_stack_ffffffffffffff90)))),
                                    in_stack_ffffffffffffff88);
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_ffffffffffffff97,
                                                  CONCAT16(in_stack_ffffffffffffff96,
                                                           CONCAT15(in_stack_ffffffffffffff95,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)))),
                                      in_stack_ffffffffffffff88);
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_ffffffffffffff97,
                                                    CONCAT16(in_stack_ffffffffffffff96,
                                                             CONCAT15(in_stack_ffffffffffffff95,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)))),
                                        in_stack_ffffffffffffff88);
                if (!bVar1) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_ffffffffffffff97,
                                                      CONCAT16(in_stack_ffffffffffffff96,
                                                               CONCAT15(in_stack_ffffffffffffff95,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)))),
                                          in_stack_ffffffffffffff88);
                  if (!bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_ffffffffffffff97,
                                                        CONCAT16(in_stack_ffffffffffffff96,
                                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90)))),
                                            in_stack_ffffffffffffff88);
                    if (!bVar1) {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_ffffffffffffff97,
                                                          CONCAT16(in_stack_ffffffffffffff96,
                                                                   CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                              in_stack_ffffffffffffff88);
                      if (!bVar1) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_ffffffffffffff97,
                                                            CONCAT16(in_stack_ffffffffffffff96,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                in_stack_ffffffffffffff88);
                        if (!bVar1) {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                                             CONCAT16(in_stack_ffffffffffffff96,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                          if (!bVar1) {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                                             CONCAT16(in_stack_ffffffffffffff96,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                            if (!bVar1) {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                                             CONCAT16(in_stack_ffffffffffffff96,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                              if (!bVar1) {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                                             CONCAT16(in_stack_ffffffffffffff96,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                                if (!bVar1) {
                                  uVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_ffffffffffffff97,
                                                             CONCAT16(in_stack_ffffffffffffff96,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                                  if (!(bool)uVar2) {
                                    uVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar2,CONCAT16(
                                                  in_stack_ffffffffffffff96,
                                                  CONCAT15(in_stack_ffffffffffffff95,
                                                           CONCAT14(in_stack_ffffffffffffff94,
                                                                    in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                                    if (!(bool)uVar3) {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(
                                                  in_stack_ffffffffffffff95,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                                      if (!bVar1) {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(bVar1,
                                                  CONCAT14(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90)))),
                                                  in_stack_ffffffffffffff88);
                                        if (bVar1) {
                                          local_4 = 6;
                                        }
                                        else {
                                          local_4 = 2;
                                        }
                                        goto LAB_0013cb05;
                                      }
                                    }
                                  }
                                  local_4 = 4;
                                  goto LAB_0013cb05;
                                }
                              }
                            }
                            local_4 = 5;
                            goto LAB_0013cb05;
                          }
                        }
                      }
                      local_4 = 3;
                      goto LAB_0013cb05;
                    }
                  }
                }
                local_4 = 2;
                goto LAB_0013cb05;
              }
            }
          }
          local_4 = 0;
          goto LAB_0013cb05;
        }
      }
    }
  }
  local_4 = 1;
LAB_0013cb05:
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int decode_charset(const char *charset) {
  std::string tmp = charset;
  toLower(&tmp);
  if (tmp == "sjis"  || tmp == "shift-jis" ||
      tmp == "shift_jis" || tmp == "cp932")
    return CP932;
  else if (tmp == "euc"   || tmp == "euc_jp" ||
           tmp == "euc-jp")
    return EUC_JP;
  else if (tmp == "utf8" || tmp == "utf_8" ||
           tmp == "utf-8")
    return UTF8;
  else if (tmp == "utf16" || tmp == "utf_16" ||
           tmp == "utf-16")
    return UTF16;
  else if (tmp == "utf16be" || tmp == "utf_16be" ||
           tmp == "utf-16be")
    return UTF16BE;
  else if (tmp == "utf16le" || tmp == "utf_16le" ||
           tmp == "utf-16le")
    return UTF16LE;
  else if (tmp == "ascii")
    return ASCII;

  return UTF8;  // default is UTF8
}